

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::single_tessellation_stage
               (NegativeTestContext *ctx)

{
  RenderContext *pRVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  mapped_type *pmVar4;
  TestError *pTVar5;
  GLenum error;
  allocator<char> local_334;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  StringTemplate local_270;
  string local_250;
  string local_230;
  StringTemplate local_210;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ProgramSources local_1c0;
  ShaderProgram program;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar3 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_NV_gpu_shader5");
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"GLSL_VERSION_STRING",(allocator<char> *)&local_1c0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&program);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"GLSL_TESS_EXTENSION_STRING",(allocator<char> *)&local_1c0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&program);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&program);
  checkTessellationSupport(ctx);
  pRVar1 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_331);
  tcu::StringTemplate::StringTemplate(&local_210,&local_230);
  tcu::StringTemplate::specialize(&local_330,&local_210,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,&local_332);
  tcu::StringTemplate::StringTemplate(&local_270,&local_290);
  tcu::StringTemplate::specialize(&local_250,&local_270,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout (vertices=3) out;\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
             ,&local_333);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_2d0,&local_2f0);
  tcu::StringTemplate::specialize(&local_2b0,(StringTemplate *)&local_2d0,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,glcts::fixed_sample_locations_values + 1,&local_334);
  makeTessPipelineSources(&local_1c0,&local_330,&local_250,&local_2b0,&local_310);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2b0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::StringTemplate::~StringTemplate(&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_330);
  tcu::StringTemplate::~StringTemplate(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&program);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "A link error is generated if a non-separable program has a tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported."
             ,(allocator<char> *)&local_330);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (bVar3) {
    if (program.m_program.m_info.linkOk != false) goto LAB_0137314e;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Program was expected to link",(allocator<char> *)&local_330);
    NegativeTestContext::fail(ctx,(string *)&local_1c0);
  }
  else {
    if (program.m_program.m_info.linkOk == false) goto LAB_0137314e;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Program was not expected to link",(allocator<char> *)&local_330
              );
    NegativeTestContext::fail(ctx,(string *)&local_1c0);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
LAB_0137314e:
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program);
  pRVar1 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_331);
  tcu::StringTemplate::StringTemplate(&local_210,&local_230);
  tcu::StringTemplate::specialize(&local_330,&local_210,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,&local_332);
  tcu::StringTemplate::StringTemplate(&local_270,&local_290);
  tcu::StringTemplate::specialize(&local_250,&local_270,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout (vertices=3) out;\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
             ,&local_333);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_2d0,&local_2f0);
  tcu::StringTemplate::specialize(&local_2b0,(StringTemplate *)&local_2d0,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,glcts::fixed_sample_locations_values + 1,&local_334);
  makeTessPipelineSources(&local_1c0,&local_330,&local_250,&local_2b0,&local_310);
  local_1c0.separable = true;
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2b0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::StringTemplate::~StringTemplate(&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_330);
  tcu::StringTemplate::~StringTemplate(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"failed to build program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTessellationTests.cpp"
               ,0x95);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "GL_INVALID_OPERATION is generated if current program state has tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported."
             ,(allocator<char> *)&local_330);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
  error = 0x502;
  if (bVar3) {
    error = 0;
  }
  NegativeTestContext::expectError(ctx,error);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&program);
  pRVar1 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_331);
  tcu::StringTemplate::StringTemplate(&local_210,&local_230);
  tcu::StringTemplate::specialize(&local_330,&local_210,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,&local_332);
  tcu::StringTemplate::StringTemplate(&local_270,&local_290);
  tcu::StringTemplate::specialize(&local_250,&local_270,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,glcts::fixed_sample_locations_values + 1,&local_333);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout(triangles) in;\n\nvoid main()\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position;\n}\n"
             ,&local_334);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_2f0,&local_310);
  tcu::StringTemplate::specialize(&local_2d0,(StringTemplate *)&local_2f0,&args);
  makeTessPipelineSources(&local_1c0,&local_330,&local_250,&local_2b0,&local_2d0);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::StringTemplate::~StringTemplate(&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_330);
  tcu::StringTemplate::~StringTemplate(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&program);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "A link error is generated if a non-separable program has a tessellation evaluation shader but no tessellation control shader."
             ,(allocator<char> *)&local_330);
  NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (program.m_program.m_info.linkOk == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Program was not expected to link",(allocator<char> *)&local_330
              );
    NegativeTestContext::fail(ctx,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&program);
  pRVar1 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_331);
  tcu::StringTemplate::StringTemplate(&local_210,&local_230);
  tcu::StringTemplate::specialize(&local_330,&local_210,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,&local_332);
  tcu::StringTemplate::StringTemplate(&local_270,&local_290);
  tcu::StringTemplate::specialize(&local_250,&local_270,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,glcts::fixed_sample_locations_values + 1,&local_333);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout(triangles) in;\n\nvoid main()\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position;\n}\n"
             ,&local_334);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_2f0,&local_310);
  tcu::StringTemplate::specialize(&local_2d0,(StringTemplate *)&local_2f0,&args);
  makeTessPipelineSources(&local_1c0,&local_330,&local_250,&local_2b0,&local_2d0);
  local_1c0.separable = true;
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,&local_1c0);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::StringTemplate::~StringTemplate(&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_330);
  tcu::StringTemplate::~StringTemplate(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&program);
  if (program.m_program.m_info.linkOk != false) {
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
    NegativeTestContext::expectError(ctx,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,
               "GL_INVALID_OPERATION is generated if current program state has tessellation evaluation shader but no tessellation control shader."
               ,(allocator<char> *)&local_330);
    NegativeTestContext::beginSection(ctx,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram(&program);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
    return;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"failed to build program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTessellationTests.cpp"
             ,0xbe);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void single_tessellation_stage (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const bool					requireTES = !ctx.getContextInfo().isExtensionSupported("GL_NV_gpu_shader5");
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]	= isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";

	checkTessellationSupport(ctx);

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   tcu::StringTemplate(tessControlShaderSource).specialize(args),
														   "")); // missing tessEvalShaderSource
		tcu::TestLog& log = ctx.getLog();
		log << program;

		ctx.beginSection("A link error is generated if a non-separable program has a tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported.");

		if (requireTES && program.isOk())
			ctx.fail("Program was not expected to link");
		else if (!requireTES && !program.isOk())
			ctx.fail("Program was expected to link");

		ctx.endSection();
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   tcu::StringTemplate(tessControlShaderSource).specialize(args),
														   "") // missing tessEvalShaderSource
								   << glu::ProgramSeparable(true));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		if (!program.isOk())
			TCU_THROW(TestError, "failed to build program");

		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if current program state has tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported.");
		ctx.glDrawArrays(GL_PATCHES, 0, 3);
		ctx.expectError(requireTES ? GL_INVALID_OPERATION : GL_NO_ERROR);
		ctx.endSection();

		ctx.glUseProgram(0);
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   "", // missing tessControlShaderSource
														   tcu::StringTemplate(tessEvalShaderSource).specialize(args)));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		ctx.beginSection("A link error is generated if a non-separable program has a tessellation evaluation shader but no tessellation control shader.");

		if (program.isOk())
			ctx.fail("Program was not expected to link");

		ctx.endSection();
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   "", // missing tessControlShaderSource
														   tcu::StringTemplate(tessEvalShaderSource).specialize(args))
									<< glu::ProgramSeparable(true));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		if (!program.isOk())
			TCU_THROW(TestError, "failed to build program");

		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if current program state has tessellation evaluation shader but no tessellation control shader.");
		ctx.glDrawArrays(GL_PATCHES, 0, 3);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
}